

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_update_dims_from_array(nifti_image *nim)

{
  bool bVar1;
  uint local_20;
  int local_1c;
  int ndim;
  int c;
  nifti_image *nim_local;
  
  if (nim == (nifti_image *)0x0) {
    fprintf(_stderr,"** update_dims: missing nim\n");
    nim_local._4_4_ = 1;
  }
  else {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"+d updating image dimensions given nim->dim:");
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        fprintf(_stderr," %d",(ulong)(uint)nim->dim[local_1c]);
      }
      fputc(10,_stderr);
    }
    if ((nim->dim[0] < 1) || (7 < nim->dim[0])) {
      fprintf(_stderr,"** invalid dim[0], dim[] = ");
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        fprintf(_stderr," %d",(ulong)(uint)nim->dim[local_1c]);
      }
      fputc(10,_stderr);
      nim_local._4_4_ = 1;
    }
    else {
      if (nim->dim[1] < 1) {
        nim->dim[1] = 1;
        nim->nx = 1;
      }
      else {
        nim->nx = nim->dim[1];
      }
      nim->dx = nim->pixdim[1];
      if ((nim->dim[0] < 2) || ((1 < nim->dim[0] && (nim->dim[2] < 1)))) {
        nim->dim[2] = 1;
        nim->ny = 1;
      }
      else {
        nim->ny = nim->dim[2];
      }
      nim->dy = nim->pixdim[2];
      if ((nim->dim[0] < 3) || ((2 < nim->dim[0] && (nim->dim[3] < 1)))) {
        nim->dim[3] = 1;
        nim->nz = 1;
      }
      else {
        nim->nz = nim->dim[3];
      }
      nim->dz = nim->pixdim[3];
      if ((nim->dim[0] < 4) || ((3 < nim->dim[0] && (nim->dim[4] < 1)))) {
        nim->dim[4] = 1;
        nim->nt = 1;
      }
      else {
        nim->nt = nim->dim[4];
      }
      nim->dt = nim->pixdim[4];
      if ((nim->dim[0] < 5) || ((4 < nim->dim[0] && (nim->dim[5] < 1)))) {
        nim->dim[5] = 1;
        nim->nu = 1;
      }
      else {
        nim->nu = nim->dim[5];
      }
      nim->du = nim->pixdim[5];
      if ((nim->dim[0] < 6) || ((5 < nim->dim[0] && (nim->dim[6] < 1)))) {
        nim->dim[6] = 1;
        nim->nv = 1;
      }
      else {
        nim->nv = nim->dim[6];
      }
      nim->dv = nim->pixdim[6];
      if ((nim->dim[0] < 7) || ((6 < nim->dim[0] && (nim->dim[7] < 1)))) {
        nim->dim[7] = 1;
        nim->nw = 1;
      }
      else {
        nim->nw = nim->dim[7];
      }
      nim->dw = nim->pixdim[7];
      local_1c = 1;
      nim->nvox = 1;
      for (; local_1c <= nim->dim[0]; local_1c = local_1c + 1) {
        nim->nvox = (long)nim->dim[local_1c] * nim->nvox;
      }
      local_20 = nim->dim[0];
      while( true ) {
        bVar1 = false;
        if (1 < (int)local_20) {
          bVar1 = nim->dim[(int)local_20] < 2;
        }
        if (!bVar1) break;
        local_20 = local_20 - 1;
      }
      if (2 < g_opts.debug) {
        fprintf(_stderr,"+d ndim = %d -> %d\n",(ulong)(uint)nim->ndim,(ulong)local_20);
        fprintf(_stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",(ulong)(uint)nim->nx,(ulong)(uint)nim->ny,
                (ulong)(uint)nim->nz,(ulong)(uint)nim->nt,nim->nu,nim->nv,nim->nw);
      }
      nim->ndim = local_20;
      nim->dim[0] = local_20;
      nim_local._4_4_ = 0;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_update_dims_from_array( nifti_image * nim )
{
   int c, ndim;

   if( !nim ){
      fprintf(stderr,"** update_dims: missing nim\n");
      return 1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d updating image dimensions given nim->dim:");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
   }

   /* verify dim[0] first */
   if(nim->dim[0] < 1 || nim->dim[0] > 7){
      fprintf(stderr,"** invalid dim[0], dim[] = ");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
      return 1;
   }

   /* set nx, ny ..., dx, dy, ..., one by one */

   /* less than 1, set to 1, else copy */
   if(nim->dim[1] < 1) nim->nx = nim->dim[1] = 1;
   else                nim->nx = nim->dim[1];
   nim->dx = nim->pixdim[1];

   /* if undefined, or less than 1, set to 1 */
   if(nim->dim[0] < 2 || (nim->dim[0] >= 2 && nim->dim[2] < 1))
      nim->ny = nim->dim[2] = 1;
   else
      nim->ny = nim->dim[2];
   /* copy delta values, in any case */
   nim->dy = nim->pixdim[2];

   if(nim->dim[0] < 3 || (nim->dim[0] >= 3 && nim->dim[3] < 1))
      nim->nz = nim->dim[3] = 1;
   else /* just copy vals from arrays */
      nim->nz = nim->dim[3];
   nim->dz = nim->pixdim[3];

   if(nim->dim[0] < 4 || (nim->dim[0] >= 4 && nim->dim[4] < 1))
      nim->nt = nim->dim[4] = 1;
   else /* just copy vals from arrays */
      nim->nt = nim->dim[4];
   nim->dt = nim->pixdim[4];

   if(nim->dim[0] < 5 || (nim->dim[0] >= 5 && nim->dim[5] < 1))
      nim->nu = nim->dim[5] = 1;
   else /* just copy vals from arrays */
      nim->nu = nim->dim[5];
   nim->du = nim->pixdim[5];

   if(nim->dim[0] < 6 || (nim->dim[0] >= 6 && nim->dim[6] < 1))
      nim->nv = nim->dim[6] = 1;
   else /* just copy vals from arrays */
      nim->nv = nim->dim[6];
   nim->dv = nim->pixdim[6];

   if(nim->dim[0] < 7 || (nim->dim[0] >= 7 && nim->dim[7] < 1))
      nim->nw = nim->dim[7] = 1;
   else /* just copy vals from arrays */
      nim->nw = nim->dim[7];
   nim->dw = nim->pixdim[7];

   for( c = 1, nim->nvox = 1; c <= nim->dim[0]; c++ )
      nim->nvox *= nim->dim[c];

   /* compute ndim, assuming it can be no larger than the old one */
   for( ndim = nim->dim[0]; (ndim > 1) && (nim->dim[ndim] <= 1); ndim-- )
       ;

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d ndim = %d -> %d\n",nim->ndim, ndim);
      fprintf(stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",
              nim->nx, nim->ny, nim->nz, nim->nt, nim->nu, nim->nv, nim->nw);
   }

   nim->dim[0] = nim->ndim = ndim;

   return 0;
}